

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pa_linux_alsa.c
# Opt level: O0

PaError OpenStream(PaUtilHostApiRepresentation *hostApi,PaStream **s,
                  PaStreamParameters *inputParameters,PaStreamParameters *outputParameters,
                  double sampleRate,unsigned_long framesPerBuffer,PaStreamFlags streamFlags,
                  PaStreamCallback *callback,void *userData)

{
  int iVar1;
  char *pcVar2;
  unsigned_long uVar3;
  PaUtilHostBufferSizeMode PVar4;
  PaStreamParameters *in_RCX;
  ulong uVar5;
  PaStreamParameters *in_RDX;
  undefined8 *in_RSI;
  void *in_RDI;
  unsigned_long in_R8;
  PaAlsaStream *in_R9;
  double in_XMM0_Qa;
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  PaSampleFormat in_stack_00000008;
  PaAlsaStream *in_stack_00000010;
  PaUtilHostBufferSizeMode hostBufferSizeMode;
  PaTime outputLatency;
  PaTime inputLatency;
  int numOutputChannels;
  int numInputChannels;
  PaSampleFormat outputSampleFormat;
  PaSampleFormat inputSampleFormat;
  PaSampleFormat hostOutputSampleFormat;
  PaSampleFormat hostInputSampleFormat;
  PaAlsaStream *stream;
  PaAlsaHostApiRepresentation *alsaHostApi;
  PaError result;
  PaAlsaStream *in_stack_ffffffffffffff00;
  PaAlsaStream *pPVar8;
  unsigned_long in_stack_ffffffffffffff08;
  double in_stack_ffffffffffffff10;
  undefined4 in_stack_ffffffffffffff18;
  StreamDirection in_stack_ffffffffffffff1c;
  PaUtilHostApiRepresentation *in_stack_ffffffffffffff20;
  PaAlsaHostApiRepresentation *in_stack_ffffffffffffff28;
  PaAlsaStream *in_stack_ffffffffffffff30;
  PaSampleFormat in_stack_ffffffffffffff38;
  PaStreamFlags in_stack_ffffffffffffff40;
  undefined4 in_stack_ffffffffffffff48;
  PaUtilHostBufferSizeMode PVar9;
  double local_b0;
  double local_a8;
  int iVar10;
  int iVar11;
  PaSampleFormat streamFlags_00;
  PaSampleFormat framesPerUserBuffer;
  PaAlsaStream *self;
  PaError local_64;
  unsigned_long local_58;
  
  self = (PaAlsaStream *)0x0;
  framesPerUserBuffer = 0;
  streamFlags_00 = 0;
  iVar11 = 0;
  iVar10 = 0;
  PVar9 = paUtilFixedHostBufferSize;
  if (((ulong)in_R9 & 0xffff0000) != 0) {
    return -0x270b;
  }
  if (in_RDX != (PaStreamParameters *)0x0) {
    paUtilErr_ = ValidateParameters((PaStreamParameters *)in_stack_ffffffffffffff28,
                                    in_stack_ffffffffffffff20,in_stack_ffffffffffffff1c);
    if (paUtilErr_ < 0) {
      PaUtil_DebugPrint(
                       "Expression \'ValidateParameters( inputParameters, hostApi, StreamDirection_In )\' failed in \'/workspace/llm4binary/github/license_c_cmakelists/rosmarinus[P]jtalkdll/portaudio/src/hostapi/alsa/pa_linux_alsa.c\', line: 2813\n"
                       );
      local_64 = paUtilErr_;
      in_R9 = in_stack_ffffffffffffff00;
      goto LAB_00113d95;
    }
    iVar11 = in_RDX->channelCount;
    framesPerUserBuffer = in_RDX->sampleFormat;
  }
  if (in_RCX != (PaStreamParameters *)0x0) {
    paUtilErr_ = ValidateParameters((PaStreamParameters *)in_stack_ffffffffffffff28,
                                    in_stack_ffffffffffffff20,in_stack_ffffffffffffff1c);
    if (paUtilErr_ < 0) {
      PaUtil_DebugPrint(
                       "Expression \'ValidateParameters( outputParameters, hostApi, StreamDirection_Out )\' failed in \'/workspace/llm4binary/github/license_c_cmakelists/rosmarinus[P]jtalkdll/portaudio/src/hostapi/alsa/pa_linux_alsa.c\', line: 2820\n"
                       );
      local_64 = paUtilErr_;
      in_R9 = in_stack_ffffffffffffff00;
      goto LAB_00113d95;
    }
    iVar10 = in_RCX->channelCount;
    streamFlags_00 = in_RCX->sampleFormat;
  }
  local_58 = in_R8;
  if ((in_R8 == 0) && (pcVar2 = getenv("PA_ALSA_PERIODSIZE"), pcVar2 != (char *)0x0)) {
    pcVar2 = getenv("PA_ALSA_PERIODSIZE");
    iVar1 = atoi(pcVar2);
    local_58 = (unsigned_long)iVar1;
  }
  self = (PaAlsaStream *)PaUtil_AllocateMemory((long)in_stack_ffffffffffffff00);
  if (self == (PaAlsaStream *)0x0) {
    PaUtil_DebugPrint(
                     "Expression \'stream = (PaAlsaStream*)PaUtil_AllocateMemory( sizeof(PaAlsaStream) )\' failed in \'/workspace/llm4binary/github/license_c_cmakelists/rosmarinus[P]jtalkdll/portaudio/src/hostapi/alsa/pa_linux_alsa.c\', line: 2833\n"
                     );
    local_64 = -0x2708;
    in_R9 = in_stack_ffffffffffffff00;
  }
  else {
    pPVar8 = in_stack_00000010;
    paUtilErr_ = PaAlsaStream_Initialize
                           (in_stack_ffffffffffffff30,in_stack_ffffffffffffff28,
                            (PaStreamParameters *)in_stack_ffffffffffffff20,
                            (PaStreamParameters *)
                            CONCAT44(in_stack_ffffffffffffff1c,in_stack_ffffffffffffff18),
                            in_stack_ffffffffffffff10,in_stack_ffffffffffffff08,
                            (PaStreamCallback *)in_stack_00000010,in_stack_ffffffffffffff40,
                            (void *)CONCAT44(PVar9,in_stack_ffffffffffffff48));
    iVar1 = (int)(in_stack_ffffffffffffff40 >> 0x20);
    if (paUtilErr_ < 0) {
      PaUtil_DebugPrint(
                       "Expression \'PaAlsaStream_Initialize( stream, alsaHostApi, inputParameters, outputParameters, sampleRate, framesPerBuffer, callback, streamFlags, userData )\' failed in \'/workspace/llm4binary/github/license_c_cmakelists/rosmarinus[P]jtalkdll/portaudio/src/hostapi/alsa/pa_linux_alsa.c\', line: 2835\n"
                       );
      local_64 = paUtilErr_;
      in_R9 = pPVar8;
    }
    else {
      paUtilErr_ = PaAlsaStream_Configure
                             (self,in_RDX,in_RCX,in_XMM0_Qa,local_58,&local_a8,&local_b0,
                              (PaUtilHostBufferSizeMode *)&stack0xffffffffffffff4c);
      if (paUtilErr_ < 0) {
        PaUtil_DebugPrint(
                         "Expression \'PaAlsaStream_Configure( stream, inputParameters, outputParameters, sampleRate, framesPerBuffer, &inputLatency, &outputLatency, &hostBufferSizeMode )\' failed in \'/workspace/llm4binary/github/license_c_cmakelists/rosmarinus[P]jtalkdll/portaudio/src/hostapi/alsa/pa_linux_alsa.c\', line: 2838\n"
                         );
        local_64 = paUtilErr_;
        in_R9 = pPVar8;
      }
      else {
        PVar4 = paUtilFixedHostBufferSize;
        if ((self->capture).hostInterleaved == 0) {
          PVar4 = 0x80000000;
        }
        uVar5 = 0;
        if ((self->playback).hostInterleaved == 0) {
          uVar5 = 0x80000000;
        }
        paUtilErr_ = PaUtil_InitializeBufferProcessor
                               ((PaUtilBufferProcessor *)CONCAT44(PVar9,in_stack_ffffffffffffff48),
                                iVar1,in_stack_ffffffffffffff38,
                                (PaSampleFormat)in_stack_ffffffffffffff30,in_stack_00000010._4_4_,
                                in_stack_00000008,CONCAT44(iVar11,iVar10),
                                (double)CONCAT44(in_stack_ffffffffffffff1c,PVar9),streamFlags_00,
                                framesPerUserBuffer,(self->playback).hostSampleFormat | uVar5,
                                (PaUtilHostBufferSizeMode)(self->capture).hostSampleFormat | PVar4,
                                (PaStreamCallback *)self,in_RDI);
        if (-1 < paUtilErr_) {
          if (0 < iVar11) {
            uVar3 = PaUtil_GetBufferProcessorInputLatencyFrames(&self->bufferProcessor);
            auVar6._8_4_ = (int)(uVar3 >> 0x20);
            auVar6._0_8_ = uVar3;
            auVar6._12_4_ = 0x45300000;
            (self->streamRepresentation).streamInfo.inputLatency =
                 local_a8 +
                 ((auVar6._8_8_ - 1.9342813113834067e+25) +
                 ((double)CONCAT44(0x43300000,(int)uVar3) - 4503599627370496.0)) / in_XMM0_Qa;
          }
          if (0 < iVar10) {
            uVar3 = PaUtil_GetBufferProcessorOutputLatencyFrames(&self->bufferProcessor);
            auVar7._8_4_ = (int)(uVar3 >> 0x20);
            auVar7._0_8_ = uVar3;
            auVar7._12_4_ = 0x45300000;
            (self->streamRepresentation).streamInfo.outputLatency =
                 local_b0 +
                 ((auVar7._8_8_ - 1.9342813113834067e+25) +
                 ((double)CONCAT44(0x43300000,(int)uVar3) - 4503599627370496.0)) / in_XMM0_Qa;
          }
          *in_RSI = self;
          return 0;
        }
        PaUtil_DebugPrint(
                         "Expression \'PaUtil_InitializeBufferProcessor( &stream->bufferProcessor, numInputChannels, inputSampleFormat, hostInputSampleFormat, numOutputChannels, outputSampleFormat, hostOutputSampleFormat, sampleRate, streamFlags, framesPerBuffer, stream->maxFramesPerHostBuffer, hostBufferSizeMode, callback, userData )\' failed in \'/workspace/llm4binary/github/license_c_cmakelists/rosmarinus[P]jtalkdll/portaudio/src/hostapi/alsa/pa_linux_alsa.c\', line: 2846\n"
                         );
        local_64 = paUtilErr_;
      }
    }
  }
LAB_00113d95:
  if (self != (PaAlsaStream *)0x0) {
    PaAlsaStream_Terminate(in_R9);
  }
  return local_64;
}

Assistant:

static PaError OpenStream( struct PaUtilHostApiRepresentation *hostApi,
                           PaStream** s,
                           const PaStreamParameters *inputParameters,
                           const PaStreamParameters *outputParameters,
                           double sampleRate,
                           unsigned long framesPerBuffer,
                           PaStreamFlags streamFlags,
                           PaStreamCallback* callback,
                           void *userData )
{
    PaError result = paNoError;
    PaAlsaHostApiRepresentation *alsaHostApi = (PaAlsaHostApiRepresentation*)hostApi;
    PaAlsaStream *stream = NULL;
    PaSampleFormat hostInputSampleFormat = 0, hostOutputSampleFormat = 0;
    PaSampleFormat inputSampleFormat = 0, outputSampleFormat = 0;
    int numInputChannels = 0, numOutputChannels = 0;
    PaTime inputLatency, outputLatency;
    /* Operate with fixed host buffer size by default, since other modes will invariably lead to block adaption */
    /* XXX: Use Bounded by default? Output tends to get stuttery with Fixed ... */
    PaUtilHostBufferSizeMode hostBufferSizeMode = paUtilFixedHostBufferSize;

    if( ( streamFlags & paPlatformSpecificFlags ) != 0 )
        return paInvalidFlag;

    if( inputParameters )
    {
        PA_ENSURE( ValidateParameters( inputParameters, hostApi, StreamDirection_In ) );

        numInputChannels = inputParameters->channelCount;
        inputSampleFormat = inputParameters->sampleFormat;
    }
    if( outputParameters )
    {
        PA_ENSURE( ValidateParameters( outputParameters, hostApi, StreamDirection_Out ) );

        numOutputChannels = outputParameters->channelCount;
        outputSampleFormat = outputParameters->sampleFormat;
    }

    /* XXX: Why do we support this anyway? */
    if( framesPerBuffer == paFramesPerBufferUnspecified && getenv( "PA_ALSA_PERIODSIZE" ) != NULL )
    {
        PA_DEBUG(( "%s: Getting framesPerBuffer (Alsa period-size) from environment\n", __FUNCTION__ ));
        framesPerBuffer = atoi( getenv("PA_ALSA_PERIODSIZE") );
    }

    PA_UNLESS( stream = (PaAlsaStream*)PaUtil_AllocateMemory( sizeof(PaAlsaStream) ), paInsufficientMemory );
    PA_ENSURE( PaAlsaStream_Initialize( stream, alsaHostApi, inputParameters, outputParameters, sampleRate,
                framesPerBuffer, callback, streamFlags, userData ) );

    PA_ENSURE( PaAlsaStream_Configure( stream, inputParameters, outputParameters, sampleRate, framesPerBuffer,
                &inputLatency, &outputLatency, &hostBufferSizeMode ) );
    hostInputSampleFormat = stream->capture.hostSampleFormat | (!stream->capture.hostInterleaved ? paNonInterleaved : 0);
    hostOutputSampleFormat = stream->playback.hostSampleFormat | (!stream->playback.hostInterleaved ? paNonInterleaved : 0);

    PA_ENSURE( PaUtil_InitializeBufferProcessor( &stream->bufferProcessor,
                    numInputChannels, inputSampleFormat, hostInputSampleFormat,
                    numOutputChannels, outputSampleFormat, hostOutputSampleFormat,
                    sampleRate, streamFlags, framesPerBuffer, stream->maxFramesPerHostBuffer,
                    hostBufferSizeMode, callback, userData ) );

    /* Ok, buffer processor is initialized, now we can deduce it's latency */
    if( numInputChannels > 0 )
        stream->streamRepresentation.streamInfo.inputLatency = inputLatency + (PaTime)(
                PaUtil_GetBufferProcessorInputLatencyFrames( &stream->bufferProcessor ) / sampleRate);
    if( numOutputChannels > 0 )
        stream->streamRepresentation.streamInfo.outputLatency = outputLatency + (PaTime)(
                PaUtil_GetBufferProcessorOutputLatencyFrames( &stream->bufferProcessor ) / sampleRate);

    PA_DEBUG(( "%s: Stream: framesPerBuffer = %lu, maxFramesPerHostBuffer = %lu, latency i=%f, o=%f\n", __FUNCTION__, framesPerBuffer, stream->maxFramesPerHostBuffer, stream->streamRepresentation.streamInfo.inputLatency, stream->streamRepresentation.streamInfo.outputLatency));

    *s = (PaStream*)stream;

    return result;

error:
    if( stream )
    {
        PA_DEBUG(( "%s: Stream in error, terminating\n", __FUNCTION__ ));
        PaAlsaStream_Terminate( stream );
    }

    return result;
}